

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void pulse_source_info_cb(pa_context *context,pa_source_info *info,int eol,void *user_data)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  char *local_30;
  
  if (eol != 0) {
    (*cubeb_pa_threaded_mainloop_signal)
              (*(pa_threaded_mainloop **)(*(long *)((long)user_data + 0x20) + 0x10),0);
    return;
  }
  local_30 = info->name;
  iVar4 = intern_device_id(*(cubeb_conflict **)((long)user_data + 0x20),&local_30);
  if (iVar4 == 0) {
    pulse_ensure_dev_list_data_list_size((pulse_dev_list_data *)user_data);
    lVar3 = *(long *)((long)user_data + 0x10);
    lVar8 = (ulong)*(uint *)((long)user_data + 0x1c) * 0x58;
    lVar1 = lVar3 + lVar8;
    puVar2 = (undefined8 *)(lVar3 + 0x40 + lVar8);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)(lVar3 + 0x30 + lVar8);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)(lVar3 + 0x20 + lVar8);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)(lVar3 + 0x10 + lVar8);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)(lVar3 + lVar8) = 0;
    ((undefined8 *)(lVar3 + lVar8))[1] = 0;
    *(undefined8 *)(lVar3 + 0x50 + lVar8) = 0;
    *(char **)(lVar3 + 8 + lVar8) = local_30;
    *(char **)(lVar3 + lVar8) = local_30;
    pcVar7 = strdup(info->description);
    *(char **)(lVar3 + 0x10 + lVar8) = pcVar7;
    pcVar7 = (*cubeb_pa_proplist_gets)(info->proplist,"sysfs.path");
    if (pcVar7 != (char *)0x0) {
      pcVar7 = strdup(pcVar7);
      *(char **)(lVar1 + 0x18) = pcVar7;
    }
    pcVar7 = (*cubeb_pa_proplist_gets)(info->proplist,"device.vendor.name");
    if (pcVar7 != (char *)0x0) {
      pcVar7 = strdup(pcVar7);
      *(char **)(lVar1 + 0x20) = pcVar7;
    }
    *(undefined4 *)(lVar1 + 0x28) = 1;
    uVar5 = 2;
    if ((info->active_port != (pa_source_port_info *)0x0) &&
       ((has_pulse_v2 == 0 || (uVar5 = 1, info->active_port->available != 1)))) {
      uVar5 = 2;
    }
    *(undefined4 *)(lVar1 + 0x2c) = uVar5;
    iVar4 = strcmp(info->name,*(char **)((long)user_data + 8));
    uVar5 = 0xf;
    if (iVar4 != 0) {
      uVar5 = 0;
    }
    *(undefined4 *)(lVar1 + 0x30) = uVar5;
    *(undefined4 *)(lVar1 + 0x34) = 0x3030;
    uVar6 = (info->sample_spec).format + ~PA_SAMPLE_ULAW;
    uVar5 = 0x1000;
    if (uVar6 < 4) {
      uVar5 = *(undefined4 *)(&DAT_00128890 + (ulong)uVar6 * 4);
    }
    *(undefined4 *)(lVar1 + 0x38) = uVar5;
    *(uint *)(lVar1 + 0x3c) = (uint)(info->channel_map).channels;
    *(uint32_t *)(lVar1 + 0x40) = (info->sample_spec).rate;
    *(undefined8 *)(lVar1 + 0x44) = 0x10005dc00;
    *(undefined8 *)(lVar1 + 0x4c) = 0;
    *(int *)((long)user_data + 0x1c) = *(int *)((long)user_data + 0x1c) + 1;
    return;
  }
  __assert_fail("NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                ,0x580,
                "void pulse_source_info_cb(pa_context *, const pa_source_info *, int, void *)");
}

Assistant:

static void
pulse_source_info_cb(pa_context * context, const pa_source_info * info, int eol,
                     void * user_data)
{
  pulse_dev_list_data * list_data = user_data;
  cubeb_device_info * devinfo;
  char const * prop = NULL;
  char const * device_id = NULL;

  (void)context;

  if (eol) {
    WRAP(pa_threaded_mainloop_signal)(list_data->context->mainloop, 0);
    return;
  }

  device_id = info->name;
  if (intern_device_id(list_data->context, &device_id) != CUBEB_OK) {
    assert(NULL);
    return;
  }

  pulse_ensure_dev_list_data_list_size(list_data);
  devinfo = &list_data->devinfo[list_data->count];
  memset(devinfo, 0, sizeof(cubeb_device_info));

  devinfo->device_id = device_id;
  devinfo->devid = (cubeb_devid)devinfo->device_id;
  devinfo->friendly_name = strdup(info->description);
  prop = WRAP(pa_proplist_gets)(info->proplist, "sysfs.path");
  if (prop)
    devinfo->group_id = strdup(prop);
  prop = WRAP(pa_proplist_gets)(info->proplist, "device.vendor.name");
  if (prop)
    devinfo->vendor_name = strdup(prop);

  devinfo->type = CUBEB_DEVICE_TYPE_INPUT;
  devinfo->state = pulse_get_state_from_source_port(info->active_port);
  devinfo->preferred = (strcmp(info->name, list_data->default_source_name) == 0)
                           ? CUBEB_DEVICE_PREF_ALL
                           : CUBEB_DEVICE_PREF_NONE;

  devinfo->format = CUBEB_DEVICE_FMT_ALL;
  devinfo->default_format =
      pulse_format_to_cubeb_format(info->sample_spec.format);
  devinfo->max_channels = info->channel_map.channels;
  devinfo->min_rate = 1;
  devinfo->max_rate = PA_RATE_MAX;
  devinfo->default_rate = info->sample_spec.rate;

  devinfo->latency_lo = 0;
  devinfo->latency_hi = 0;

  list_data->count += 1;
}